

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

JsValueRef
Debugger::SetBreakpoint
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  char16_t *format;
  ulong uVar4;
  JsValueRef local_38;
  JsValueRef bpObject;
  uint local_28;
  int scriptId;
  int line;
  int column;
  
  local_38 = (JsValueRef)0x0;
  if (3 < argumentCount) {
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                      (arguments[1],(int *)((long)&bpObject + 4));
    if (JVar1 == JsNoError) {
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)(arguments[2],(int *)&local_28);
      if (JVar1 == JsNoError) {
        JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)(arguments[3],&scriptId);
        if (JVar1 == JsNoError) {
          JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagSetBreakpoint)
                            (bpObject._4_4_,local_28,scriptId,&local_38);
          if (JVar1 == JsNoError) {
            return local_38;
          }
          uVar4 = (ulong)JVar1;
          pPVar2 = PAL_get_stderr(0);
          pWVar3 = Helpers::JsErrorCodeToString(JVar1);
          format = 
          L"ERROR: ChakraRTInterface::JsDiagSetBreakpoint(scriptId, line, column, &bpObject) failed. JsErrorCode=0x%x (%s)\n"
          ;
        }
        else {
          uVar4 = (ulong)JVar1;
          pPVar2 = PAL_get_stderr(0);
          pWVar3 = Helpers::JsErrorCodeToString(JVar1);
          format = 
          L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[3], &column) failed. JsErrorCode=0x%x (%s)\n"
          ;
        }
      }
      else {
        uVar4 = (ulong)JVar1;
        pPVar2 = PAL_get_stderr(0);
        pWVar3 = Helpers::JsErrorCodeToString(JVar1);
        format = 
        L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[2], &line) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      uVar4 = (ulong)JVar1;
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      format = 
      L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &scriptId) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar2,format,uVar4,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef Debugger::SetBreakpoint(JsValueRef callee, bool isConstructCall, JsValueRef * arguments, unsigned short argumentCount, void * callbackState)
{
    int scriptId;
    int line;
    int column;
    JsValueRef bpObject = JS_INVALID_REFERENCE;

    if (argumentCount > 3)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &scriptId));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[2], &line));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[3], &column));

        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagSetBreakpoint(scriptId, line, column, &bpObject));
    }

    return bpObject;
}